

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O3

void __thiscall
Assimp::ObjExporter::AddMesh(ObjExporter *this,aiString *name,aiMesh *m,aiMatrix4x4 *mat)

{
  pointer pFVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  uint uVar7;
  pointer pMVar8;
  aiFace *paVar9;
  aiVector3D *paVar10;
  aiColor4D *paVar11;
  int iVar12;
  char cVar13;
  long lVar14;
  ulong uVar15;
  vector<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_> *this_00
  ;
  undefined1 local_a0 [8];
  float local_98;
  ai_real aStack_94;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Alloc_hider local_80;
  size_type sStack_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  vector<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_> local_60;
  ulong local_48;
  indexMap<aiVector3t<float>,_Assimp::ObjExporter::aiVectorCompare> *local_40;
  aiFace *local_38;
  
  sStack_78 = 0;
  local_70._8_8_ = 0;
  local_90._M_allocated_capacity._0_4_ = 0;
  local_90._M_allocated_capacity._4_4_ = 0.0;
  local_90._8_8_ = 0;
  local_98 = 0.0;
  aStack_94 = 0.0;
  local_70._M_allocated_capacity = 0;
  local_60.super__Vector_base<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.super__Vector_base<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.super__Vector_base<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0 = (undefined1  [8])&local_90;
  local_80._M_p = (pointer)&local_70;
  std::vector<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>
  ::emplace_back<Assimp::ObjExporter::MeshInstance>(&this->mMeshes,(MeshInstance *)local_a0);
  std::vector<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>::~vector
            (&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_p != &local_70) {
    operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
  }
  if (local_a0 != (undefined1  [8])&local_90) {
    operator_delete((void *)local_a0,
                    CONCAT44(local_90._M_allocated_capacity._4_4_,
                             local_90._M_allocated_capacity._0_4_) + 1);
  }
  pMVar8 = (this->mMeshes).
           super__Vector_base<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (m->mColors[0] != (aiColor4D *)0x0) {
    this->useVc = true;
  }
  local_a0 = (undefined1  [8])&local_90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,name->data,name->data + name->length);
  std::__cxx11::string::operator=((string *)(pMVar8 + -1),(string *)local_a0);
  if (local_a0 != (undefined1  [8])&local_90) {
    operator_delete((void *)local_a0,
                    CONCAT44(local_90._M_allocated_capacity._4_4_,
                             local_90._M_allocated_capacity._0_4_) + 1);
  }
  GetMaterialName_abi_cxx11_((string *)local_a0,this,m->mMaterialIndex);
  std::__cxx11::string::operator=((string *)&pMVar8[-1].matname,(string *)local_a0);
  if (local_a0 != (undefined1  [8])&local_90) {
    operator_delete((void *)local_a0,
                    CONCAT44(local_90._M_allocated_capacity._4_4_,
                             local_90._M_allocated_capacity._0_4_) + 1);
  }
  std::vector<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>::resize
            (&pMVar8[-1].faces,(ulong)m->mNumFaces);
  if (m->mNumFaces != 0) {
    local_40 = &this->mVnMap;
    uVar15 = 0;
    do {
      paVar9 = m->mFaces;
      cVar13 = 'f';
      if (paVar9[uVar15].mNumIndices == 2) {
        cVar13 = 'l';
      }
      if (paVar9[uVar15].mNumIndices == 1) {
        cVar13 = 'p';
      }
      pFVar1 = pMVar8[-1].faces.
               super__Vector_base<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar15;
      this_00 = &pFVar1->indices;
      pFVar1->kind = cVar13;
      local_48 = uVar15;
      std::vector<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
      ::resize(this_00,(ulong)paVar9[uVar15].mNumIndices);
      if (paVar9[uVar15].mNumIndices != 0) {
        local_38 = paVar9 + uVar15;
        lVar14 = 0;
        uVar15 = 0;
        do {
          uVar7 = local_38->mIndices[uVar15];
          paVar10 = m->mVertices;
          paVar11 = m->mColors[0];
          fVar2 = paVar10[uVar7].x;
          fVar3 = paVar10[uVar7].y;
          fVar4 = paVar10[uVar7].z;
          local_98 = fVar4 * mat->c3 + fVar2 * mat->c1 + fVar3 * mat->c2 + mat->c4;
          if (paVar11 == (aiColor4D *)0x0) {
            aStack_94 = 0.0;
            local_90._M_allocated_capacity._0_4_ = 0;
            local_90._M_allocated_capacity._4_4_ = 0.0;
          }
          else {
            local_90._M_allocated_capacity._4_4_ = paVar11[uVar7].b;
            uVar5 = paVar11[uVar7].r;
            uVar6 = paVar11[uVar7].g;
            aStack_94 = (ai_real)uVar5;
            local_90._M_allocated_capacity._0_4_ = uVar6;
          }
          local_a0._4_4_ = mat->b4 + fVar4 * mat->b3 + fVar2 * mat->b1 + mat->b2 * fVar3;
          local_a0._0_4_ = mat->a4 + fVar4 * mat->a3 + fVar2 * mat->a1 + mat->a2 * fVar3;
          iVar12 = indexMap<Assimp::ObjExporter::vertexData,_Assimp::ObjExporter::vertexDataCompare>
                   ::getIndex(&this->mVpMap,(vertexData *)local_a0);
          *(int *)((long)&((this_00->
                           super__Vector_base<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
                           )._M_impl.super__Vector_impl_data._M_start)->vp + lVar14) = iVar12;
          paVar10 = m->mNormals;
          if (paVar10 == (aiVector3D *)0x0) {
            *(undefined4 *)
             ((long)&((this_00->
                      super__Vector_base<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
                      )._M_impl.super__Vector_impl_data._M_start)->vn + lVar14) = 0;
          }
          else {
            fVar2 = paVar10[uVar7].x;
            fVar3 = paVar10[uVar7].y;
            fVar4 = paVar10[uVar7].z;
            local_98 = fVar4 * mat->c3 + fVar2 * mat->c1 + fVar3 * mat->c2;
            local_a0 = (undefined1  [8])
                       CONCAT44(fVar4 * mat->b3 + fVar2 * mat->b1 + fVar3 * mat->b2,
                                fVar4 * mat->a3 + fVar2 * mat->a1 + fVar3 * mat->a2);
            iVar12 = indexMap<aiVector3t<float>,_Assimp::ObjExporter::aiVectorCompare>::getIndex
                               (local_40,(aiVector3t<float> *)local_a0);
            *(int *)((long)&((this_00->
                             super__Vector_base<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
                             )._M_impl.super__Vector_impl_data._M_start)->vn + lVar14) = iVar12;
          }
          if (m->mTextureCoords[0] == (aiVector3D *)0x0) {
            iVar12 = 0;
          }
          else {
            iVar12 = indexMap<aiVector3t<float>,_Assimp::ObjExporter::aiVectorCompare>::getIndex
                               (&this->mVtMap,m->mTextureCoords[0] + uVar7);
          }
          *(int *)((long)&((this_00->
                           super__Vector_base<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
                           )._M_impl.super__Vector_impl_data._M_start)->vt + lVar14) = iVar12;
          uVar15 = uVar15 + 1;
          lVar14 = lVar14 + 0xc;
        } while (uVar15 < local_38->mNumIndices);
      }
      uVar15 = local_48 + 1;
    } while (uVar15 < m->mNumFaces);
  }
  return;
}

Assistant:

void ObjExporter::AddMesh(const aiString& name, const aiMesh* m, const aiMatrix4x4& mat) {
    mMeshes.push_back(MeshInstance() );
    MeshInstance& mesh = mMeshes.back();

    if ( nullptr != m->mColors[ 0 ] ) {
        useVc = true;
    }

    mesh.name = std::string( name.data, name.length );
    mesh.matname = GetMaterialName(m->mMaterialIndex);

    mesh.faces.resize(m->mNumFaces);

    for(unsigned int i = 0; i < m->mNumFaces; ++i) {
        const aiFace& f = m->mFaces[i];

        Face& face = mesh.faces[i];
        switch (f.mNumIndices) {
            case 1:
                face.kind = 'p';
                break;
            case 2:
                face.kind = 'l';
                break;
            default:
                face.kind = 'f';
        }
        face.indices.resize(f.mNumIndices);

        for(unsigned int a = 0; a < f.mNumIndices; ++a) {
            const unsigned int idx = f.mIndices[a];

            aiVector3D vert = mat * m->mVertices[idx];

            if ( nullptr != m->mColors[ 0 ] ) {
                aiColor4D col4 = m->mColors[ 0 ][ idx ];
                face.indices[a].vp = mVpMap.getIndex({vert, aiColor3D(col4.r, col4.g, col4.b)});
            } else {
                face.indices[a].vp = mVpMap.getIndex({vert, aiColor3D(0,0,0)});
            }

            if (m->mNormals) {
                aiVector3D norm = aiMatrix3x3(mat) * m->mNormals[idx];
                face.indices[a].vn = mVnMap.getIndex(norm);
            } else {
                face.indices[a].vn = 0;
            }

            if ( m->mTextureCoords[ 0 ] ) {
                face.indices[a].vt = mVtMap.getIndex(m->mTextureCoords[0][idx]);
            } else {
                face.indices[a].vt = 0;
            }
        }
    }
}